

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::createPrimRefArray_presplit<embree::QuadMesh,embree::sse2::QuadSplitterFactory>
          (PrimInfo *__return_storage_ptr__,sse2 *this,Scene *scene,GTypeMask types,bool mblur,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  PrimInfo *pPVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  anon_class_8_1_898bcfc2_conflict5 aVar5;
  runtime_error *prVar6;
  ulong uVar7;
  ulong uVar8;
  MemoryMonitorInterface *pMVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined7 in_register_00000081;
  long lVar13;
  anon_class_48_6_afa08d2e *paVar14;
  ulong uVar15;
  ulong uVar16;
  Iterator2 iter;
  size_t taskCount;
  anon_class_8_1_a89d07ac primitiveArea;
  anon_class_8_1_78f12065 split_primitive;
  TriangleSplitterFactory Splitter;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  anon_class_8_1_a89d07ac *in_stack_ffffffffffffd1f8;
  undefined1 local_2e00 [16];
  Scene *local_2df0;
  char local_2de8;
  sse2 *local_2de0;
  undefined1 *local_2dd8;
  anon_class_8_1_898bcfc2_conflict5 local_2dd0;
  undefined1 local_2dc8 [24];
  undefined1 *puStack_2db0;
  undefined1 local_2da8 [16];
  undefined1 local_2d98 [16];
  _func_int **local_2d88;
  _func_int **pp_Stack_2d80;
  PrimInfo *local_2d70;
  size_t local_2d68;
  sse2 *local_2d60;
  auto_partitioner *local_2d58;
  undefined1 *local_2d50;
  sse2 *local_2d48;
  anon_class_48_6_afa08d2e *local_2d40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2d38;
  undefined1 *local_2d30;
  undefined1 *local_2d28;
  sse2 **local_2d20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d18;
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  undefined8 local_2cf8;
  undefined8 uStack_2cf0;
  undefined8 local_2ce8;
  undefined8 uStack_2ce0;
  _func_int **local_2cd8;
  _func_int **pp_Stack_2cd0;
  task_group_context local_2cc8;
  MemoryMonitorInterface local_2c48;
  long local_2c40 [7];
  long alStack_2c08 [56];
  ulong local_2a48 [64];
  anon_class_48_6_afa08d2e *local_2848;
  ulong local_2840;
  MemoryMonitorInterface local_13f8 [633];
  
  local_2de0 = (sse2 *)CONCAT71(in_register_00000081,mblur);
  local_2848 = (anon_class_48_6_afa08d2e *)0x0;
  local_2de8 = (char)types;
  uVar15 = 0;
  local_2e00._8_8_ = this;
  local_2df0 = scene;
  local_2d70 = __return_storage_ptr__;
  local_2d60 = this;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)();
  if (*(long *)(local_2e00._8_8_ + 0x1d8) != 0) {
    uVar15 = 0;
    lVar13 = 0;
    do {
      lVar10 = *(long *)(*(long *)(local_2e00._8_8_ + 0x1e8) + lVar13 * 8);
      if ((((lVar10 == 0) || ((*(uint *)(lVar10 + 0x3c) >> 0x15 & 1) == 0)) ||
          (((ulong)local_2df0 & (long)(1 << ((byte)*(uint *)(lVar10 + 0x3c) & 0x1f))) == 0)) ||
         ((bool)local_2de8 != (*(int *)(lVar10 + 0x24) != 1))) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)*(uint *)(lVar10 + 0x20);
      }
      uVar15 = uVar15 + uVar7;
      lVar13 = lVar13 + 1;
    } while (*(long *)(local_2e00._8_8_ + 0x1d8) != lVar13);
  }
  local_2840 = uVar15;
  iVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar7 = uVar15 + 0x3ff >> 10;
  if ((ulong)(long)iVar3 < uVar7) {
    uVar7 = (long)iVar3;
  }
  uVar12 = 0x40;
  if (uVar7 < 0x40) {
    uVar12 = uVar7;
  }
  local_2848 = (anon_class_48_6_afa08d2e *)(uVar12 + (uVar12 == 0));
  local_2c48._vptr_MemoryMonitorInterface = (_func_int **)0x0;
  local_2a48[0] = 0;
  if (1 < uVar7) {
    uVar12 = 0;
    uVar7 = uVar15 / (ulong)local_2848;
    paVar14 = (anon_class_48_6_afa08d2e *)0x1;
    lVar13 = 0;
    do {
      lVar10 = *(long *)(*(long *)(local_2e00._8_8_ + 0x1e8) + lVar13 * 8);
      if (((lVar10 == 0) || ((*(uint *)(lVar10 + 0x3c) >> 0x15 & 1) == 0)) ||
         ((((ulong)local_2df0 & (long)(1 << ((byte)*(uint *)(lVar10 + 0x3c) & 0x1f))) == 0 ||
          ((bool)local_2de8 != (*(int *)(lVar10 + 0x24) != 1))))) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)*(uint *)(lVar10 + 0x20);
      }
      if (uVar11 == 0) {
        lVar10 = 0;
      }
      else {
        uVar8 = (long)((long)&paVar14->state + 1U) * uVar15;
        lVar10 = 0;
        uVar16 = 0;
        do {
          uVar4 = uVar7;
          uVar7 = uVar4;
          if ((uVar12 + uVar11 + lVar10 < uVar4) || (local_2848 <= paVar14)) break;
          *(long *)((long)alStack_2c08 + ((long)(paVar14 + 0xffffffffffffffff) + 0x28U) * 8) =
               lVar13;
          uVar16 = uVar16 + (uVar4 - uVar12);
          *(ulong *)((long)local_2a48 + (long)paVar14 * 8) = uVar16;
          paVar14 = (anon_class_48_6_afa08d2e *)((long)&paVar14->state + 1);
          uVar7 = uVar8 / (ulong)local_2848;
          lVar10 = -uVar16;
          uVar8 = uVar8 + uVar15;
          uVar12 = uVar4;
        } while (uVar16 < uVar11);
      }
      uVar12 = uVar12 + uVar11 + lVar10;
      lVar13 = lVar13 + 1;
    } while (paVar14 < local_2848);
  }
  paVar14 = local_2848;
  local_2d18._0_8_ = 0x7f8000007f800000;
  local_2d18._8_8_ = 0x7f8000007f800000;
  local_2d08 = 0xff800000ff800000;
  uStack_2d00 = 0xff800000ff800000;
  local_2cf8 = 0x7f8000007f800000;
  uStack_2cf0 = 0x7f8000007f800000;
  local_2ce8 = 0xff800000ff800000;
  uStack_2ce0 = 0xff800000ff800000;
  local_2cd8 = (_func_int **)0x0;
  pp_Stack_2cd0 = (_func_int **)0x0;
  local_2d48 = (sse2 *)&local_2dd8;
  local_2e00._0_8_ = local_2e00 + 8;
  local_2dc8._8_8_ = &local_2dd0;
  local_2dc8._0_8_ = &local_2c48;
  puStack_2db0 = local_2e00;
  local_2dc8._16_8_ = &local_2d18;
  local_2da8._8_8_ = &local_2d48;
  local_2da8._0_8_ = &stack0xffffffffffffd1fe;
  local_2cc8.my_version = proxy_support;
  local_2cc8.my_traits = (context_traits)0x4;
  local_2cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_2cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_2cc8.my_name = CUSTOM_CTX;
  local_2dd8 = (undefined1 *)numPrimRefs;
  local_2dd0.func = local_2848;
  local_2d40 = (anon_class_48_6_afa08d2e *)local_2e00._0_8_;
  tbb::detail::r1::initialize(&local_2cc8);
  local_2d58 = (auto_partitioner *)local_2dc8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,(unsigned_long)paVar14,1,(anon_class_8_1_898bcfc2_conflict5 *)&local_2d58,
             (auto_partitioner *)&local_2d68,&local_2cc8);
  cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
  if (cVar2 != '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"task cancelled");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_2cc8);
  local_2dc8._8_8_ = local_2d18._8_8_;
  local_2dc8._0_8_ = local_2d18._0_8_;
  puStack_2db0 = (undefined1 *)uStack_2d00;
  local_2dc8._16_8_ = local_2d08;
  local_2da8._8_8_ = uStack_2cf0;
  local_2da8._0_8_ = local_2cf8;
  local_2d98._8_8_ = uStack_2ce0;
  local_2d98._0_8_ = local_2ce8;
  local_2d88 = local_2cd8;
  pp_Stack_2d80 = pp_Stack_2cd0;
  if (local_2dd0.func != (anon_class_48_6_afa08d2e *)0x0) {
    pMVar9 = local_13f8;
    aVar5.func = local_2dd0.func;
    do {
      *(undefined1 (*) [16])(pMVar9 + -8) = local_2dc8._0_16_;
      *(undefined1 (*) [16])(pMVar9 + -6) = register0x00001280;
      *(undefined1 (*) [16])(pMVar9 + -4) = local_2da8;
      *(undefined1 (*) [16])(pMVar9 + -2) = local_2d98;
      pMVar9->_vptr_MemoryMonitorInterface = local_2d88;
      pMVar9[1]._vptr_MemoryMonitorInterface = pp_Stack_2d80;
      local_2dc8._0_16_ = minps(local_2dc8._0_16_,*(undefined1 (*) [16])(pMVar9 + -0x288));
      register0x00001280 = maxps(register0x00001280,*(undefined1 (*) [16])(pMVar9 + -0x286));
      local_2da8 = minps(local_2da8,*(undefined1 (*) [16])(pMVar9 + -0x284));
      local_2d98 = maxps(local_2d98,*(undefined1 (*) [16])(pMVar9 + -0x282));
      local_2d88 = (_func_int **)
                   ((long)local_2d88 + (long)pMVar9[-0x280]._vptr_MemoryMonitorInterface);
      pp_Stack_2d80 =
           (_func_int **)((long)pp_Stack_2d80 + (long)pMVar9[-0x27f]._vptr_MemoryMonitorInterface);
      pMVar9 = pMVar9 + 10;
      aVar5.func = (anon_class_48_6_afa08d2e *)((long)&aVar5.func[-1].func + 7);
    } while (aVar5.func != (anon_class_48_6_afa08d2e *)0x0);
  }
  if ((sse2 *)((long)pp_Stack_2d80 - (long)local_2d88) != local_2de0) {
    (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
    paVar14 = local_2848;
    local_2d18._0_8_ = 0x7f8000007f800000;
    local_2d18._8_8_ = 0x7f8000007f800000;
    local_2d08 = 0xff800000ff800000;
    uStack_2d00 = 0xff800000ff800000;
    local_2cf8 = 0x7f8000007f800000;
    uStack_2cf0 = 0x7f8000007f800000;
    local_2ce8 = 0xff800000ff800000;
    uStack_2ce0 = 0xff800000ff800000;
    local_2cd8 = (_func_int **)0x0;
    pp_Stack_2cd0 = (_func_int **)0x0;
    local_2dd8 = local_2e00 + 8;
    local_2e00._0_8_ = local_2848;
    local_2d48 = (sse2 *)&local_2c48;
    local_2d40 = (anon_class_48_6_afa08d2e *)local_2e00;
    local_2d30 = (undefined1 *)&local_2dd8;
    local_2d28 = &stack0xffffffffffffd1ff;
    local_2d20 = (sse2 **)&local_2d58;
    local_2cc8.my_version = proxy_support;
    local_2cc8.my_traits = (context_traits)0x4;
    local_2cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_2cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_2cc8.my_name = CUSTOM_CTX;
    local_2d68 = numPrimRefs;
    local_2d58 = (auto_partitioner *)&local_2d68;
    local_2d50 = local_2dd8;
    local_2d38 = &local_2d18;
    tbb::detail::r1::initialize(&local_2cc8);
    local_2dd0.func = (anon_class_48_6_afa08d2e *)&local_2d48;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,(unsigned_long)paVar14,1,&local_2dd0,(auto_partitioner *)&stack0xffffffffffffd1fe,
               &local_2cc8);
    cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
    if (cVar2 != '\0') {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"task cancelled");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_2cc8);
    local_2dc8._8_8_ = local_2d18._8_8_;
    local_2dc8._0_8_ = local_2d18._0_8_;
    puStack_2db0 = (undefined1 *)uStack_2d00;
    local_2dc8._16_8_ = local_2d08;
    local_2da8._8_8_ = uStack_2cf0;
    local_2da8._0_8_ = local_2cf8;
    local_2d98._8_8_ = uStack_2ce0;
    local_2d98._0_8_ = local_2ce8;
    local_2d88 = local_2cd8;
    pp_Stack_2d80 = pp_Stack_2cd0;
    if ((anon_class_48_6_afa08d2e *)local_2e00._0_8_ != (anon_class_48_6_afa08d2e *)0x0) {
      pMVar9 = local_13f8;
      paVar14 = (anon_class_48_6_afa08d2e *)local_2e00._0_8_;
      do {
        *(undefined1 (*) [16])(pMVar9 + -8) = local_2dc8._0_16_;
        *(undefined1 (*) [16])(pMVar9 + -6) = register0x00001280;
        *(undefined1 (*) [16])(pMVar9 + -4) = local_2da8;
        *(undefined1 (*) [16])(pMVar9 + -2) = local_2d98;
        pMVar9->_vptr_MemoryMonitorInterface = local_2d88;
        pMVar9[1]._vptr_MemoryMonitorInterface = pp_Stack_2d80;
        local_2dc8._0_16_ = minps(local_2dc8._0_16_,*(undefined1 (*) [16])(pMVar9 + -0x288));
        register0x00001280 = maxps(register0x00001280,*(undefined1 (*) [16])(pMVar9 + -0x286));
        local_2da8 = minps(local_2da8,*(undefined1 (*) [16])(pMVar9 + -0x284));
        local_2d98 = maxps(local_2d98,*(undefined1 (*) [16])(pMVar9 + -0x282));
        local_2d88 = (_func_int **)
                     ((long)local_2d88 + (long)pMVar9[-0x280]._vptr_MemoryMonitorInterface);
        pp_Stack_2d80 =
             (_func_int **)((long)pp_Stack_2d80 + (long)pMVar9[-0x27f]._vptr_MemoryMonitorInterface)
        ;
        pMVar9 = pMVar9 + 10;
        paVar14 = (anon_class_48_6_afa08d2e *)((long)(paVar14 + 0xffffffffffffffff) + 0x2f);
      } while (paVar14 != (anon_class_48_6_afa08d2e *)0x0);
    }
  }
  pPVar1 = local_2d70;
  local_2d48 = (sse2 *)&local_2d60;
  local_2cc8.my_cpu_ctl_env = (uint64_t)local_2d60;
  local_2d18._0_8_ = &local_2cc8;
  createPrimRefArray_presplit<embree::sse2::createPrimRefArray_presplit<embree::QuadMesh,embree::sse2::QuadSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&,unsigned_int,embree::sse2::SplittingGrid_const&,embree::PrimRef*,unsigned_int&)_1_,embree::sse2::createPrimRefArray_presplit<embree::QuadMesh,embree::sse2::QuadSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&)_1_,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>>
            (local_2d70,local_2de0,numPrimRefs,
             (vector_t<embree::PrimRef,_embree::aligned_monitored_allocator<embree::PrimRef,_32UL>_>
              *)local_2dc8,(PrimInfo *)&local_2d18.field_1,(anon_class_8_1_78f12065 *)&local_2d48,
             in_stack_ffffffffffffd1f8);
  return pPVar1;
}

Assistant:

PrimInfo createPrimRefArray_presplit(Scene* scene, Geometry::GTypeMask types, bool mblur, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,mblur);

      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
	  return mesh->createPrimRefArray(prims,r,k,(unsigned)geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
	      return mesh->createPrimRefArray(prims,r,base.size(),(unsigned)geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}


      SplitterFactory Splitter(scene);
        
      auto split_primitive = [&] (const PrimRef &prim,
                                  const unsigned int splitprims,
                                  const SplittingGrid& grid,
                                  PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                                  unsigned int& numSubPrims)
      {
         const auto splitter = Splitter(prim);
         splitPrimitive(splitter,prim,splitprims,grid,subPrims,numSubPrims);
      };
      
      auto primitiveArea = [&] (const PrimRef &ref) {
        const unsigned int geomID = ref.geomID();
        const unsigned int primID = ref.primID();
        return ((Mesh*)scene->get(geomID))->projectedPrimitiveArea(primID);
      };
      
      return createPrimRefArray_presplit(numPrimRefs,prims,pinfo,split_primitive,primitiveArea);
    }